

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

typed_address<pstore::index::header_block> __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::flush(hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
        *this,transaction_base *transaction,uint generation)

{
  uint uVar1;
  internal_node *piVar2;
  uint uVar3;
  address aVar4;
  typed_address<pstore::index::header_block> tVar5;
  
  uVar1 = this->revision_;
  uVar3 = database::get_current_revision(transaction->db_);
  if (uVar1 != uVar3) {
    raise<pstore::error_code>(index_not_latest_revision);
  }
  piVar2 = (this->root_).internal_;
  if (((ulong)piVar2 & 2) != 0) {
    if (((ulong)piVar2 & 1) == 0) {
      assert_failed("root_.is_internal ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x412);
    }
    aVar4 = details::internal_node::flush
                      ((internal_node *)((ulong)piVar2 & 0xfffffffffffffffc),transaction,0);
    (this->root_).addr_.a_ = aVar4.a_;
    if ((aVar4.a_ & 2) != 0) {
      assert_failed("root_.is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x414);
    }
  }
  if (this->size_ == 0) {
    tVar5.a_.a_ = (address)0;
  }
  else {
    tVar5 = write_header_block(this,transaction);
  }
  chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::clear
            ((this->internals_container_)._M_t.
             super___uniq_ptr_impl<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_*,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
             .
             super__Head_base<0UL,_pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_*,_false>
             ._M_head_impl);
  this->revision_ = generation;
  return (address)tVar5.a_.a_;
}

Assistant:

typed_address<header_block>
        hamt_map<KeyType, ValueType, Hash, KeyEqual>::flush (transaction_base & transaction,
                                                             unsigned const generation) {
            if (revision_ != transaction.db ().get_current_revision ()) {
                raise (error_code::index_not_latest_revision);
            }

            // If the root is a leaf, there's nothing to do. If not, we start to recursively flush
            // the tree.
            if (!root_.is_address ()) {
                PSTORE_ASSERT (root_.is_internal ());
                root_ = root_.untag<internal_node *> ()->flush (transaction, 0 /*shifts*/);
                PSTORE_ASSERT (root_.is_address ());
                // Don't delete the internal node here. They are owned by internals_container_. If
                // this ever changes, then use something like 'delete internal' here.
            }

            auto const header_addr = this->size () > 0U ? this->write_header_block (transaction)
                                                        : typed_address<header_block>::null ();

            // Release all of the in-heap internal nodes that we have now flushed.
            internals_container_->clear ();

            // Update the revision number into which the index will be flushed.
            revision_ = generation;

            return header_addr;
        }